

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  atomic<int> *paVar2;
  BuildRef *pBVar3;
  long *plVar4;
  Vec3fx *pVVar5;
  float fVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  Geometry *pGVar10;
  BVH *pBVar11;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> this_01;
  BuildRef *pBVar12;
  MutexSys *pMVar13;
  ThreadLocal2 *this_02;
  ulong uVar14;
  undefined4 *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  Geometry *geometry;
  long lVar21;
  Lock<embree::MutexSys> lock;
  MutexSys *local_e8;
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *local_e0;
  mvector<PrimRef> local_d8;
  Lock<embree::MutexSys> local_b0;
  RefBuilderSmall *local_a0;
  long *local_98;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  local_90;
  PrimInfo pinfo;
  
  sVar20 = this->objectID_;
  pGVar10 = (topBuilder->scene->geometries).items[sVar20].ptr;
  geometry = (Geometry *)0x0;
  if ((pGVar10 != (Geometry *)0x0) && (*(char *)&pGVar10->field_8 == '\x1d')) {
    geometry = pGVar10;
  }
  uVar8 = geometry->numPrimitives;
  uVar19 = (ulong)uVar8;
  lVar21 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_d8.alloc.device = (MemoryMonitorInterface *)(lVar21 + 0x550);
  if (lVar21 == 0) {
    local_d8.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_d8.items = (PrimRef *)0x0;
  local_d8.alloc.hugepages = false;
  local_d8.size_active = 0;
  local_d8.size_alloced = 0;
  local_a0 = this;
  if (uVar19 != 0) {
    sVar20 = uVar19 << 5;
    (**(local_d8.alloc.device)->_vptr_MemoryMonitorInterface)(local_d8.alloc.device,sVar20,0);
    if (uVar8 < 0xe0000) {
      local_d8.items = (PrimRef *)alignedMalloc(sVar20,0x20);
    }
    else {
      local_d8.items = (PrimRef *)os_malloc(sVar20,&local_d8.alloc.hugepages);
    }
    sVar20 = local_a0->objectID_;
    local_d8.size_alloced = uVar19;
  }
  local_d8.size_active = local_d8.size_alloced;
  sse2::createPrimRefArray
            (&pinfo,geometry,(uint)sVar20,uVar19,&local_d8,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  lVar21 = 0x1c;
  local_98 = (long *)__tls_get_addr();
  uVar19 = 0;
  local_e0 = topBuilder;
  do {
    sVar20 = local_d8.size_alloced;
    if (pinfo.end - pinfo.begin <= uVar19) {
      if (local_d8.items != (PrimRef *)0x0) {
        if (local_d8.size_alloced << 5 < 0x1c00000) {
          alignedFree(local_d8.items);
        }
        else {
          os_free(local_d8.items,local_d8.size_alloced << 5,local_d8.alloc.hugepages);
        }
      }
      if (sVar20 != 0) {
        (**(local_d8.alloc.device)->_vptr_MemoryMonitorInterface)
                  (local_d8.alloc.device,sVar20 * -0x20,1);
      }
      return;
    }
    pBVar11 = local_e0->bvh;
    this_02 = (ThreadLocal2 *)*local_98;
    if (this_02 == (ThreadLocal2 *)0x0) {
      this_02 = (ThreadLocal2 *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys((MutexSys *)this_02);
      (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_02->alloc0).parent = this_02;
      (this_02->alloc0).ptr = (char *)0x0;
      (this_02->alloc0).cur = 0;
      (this_02->alloc0).end = 0;
      (this_02->alloc0).allocBlockSize = 0;
      (this_02->alloc0).bytesUsed = 0;
      (this_02->alloc0).bytesWasted = 0;
      (this_02->alloc1).parent = this_02;
      (this_02->alloc1).ptr = (char *)0x0;
      (this_02->alloc1).cur = 0;
      (this_02->alloc1).end = 0;
      (this_02->alloc1).allocBlockSize = 0;
      (this_02->alloc1).bytesUsed = 0;
      (this_02->alloc1).bytesWasted = 0;
      *local_98 = (long)this_02;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_b0.mutex = (MutexSys *)this_02;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&local_b0);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&local_b0);
      Lock<embree::MutexSys>::~Lock(&lock);
    }
    this_00 = &pBVar11->alloc;
    uVar17 = (ulong)(((pBVar11->alloc).use_single_mode ^ 1) << 6);
    local_e8 = (MutexSys *)0x8;
    this_01._M_head_impl = *(ThreadLocal2 **)((long)&(this_02->alloc0).parent + uVar17);
    if (this_00 != ((this_01._M_head_impl)->alloc)._M_b._M_p) {
      local_b0.locked = true;
      local_b0.mutex = &(this_01._M_head_impl)->mutex;
      MutexSys::lock(&(this_01._M_head_impl)->mutex);
      if (((this_01._M_head_impl)->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             ((this_01._M_head_impl)->alloc1).bytesUsed + ((this_01._M_head_impl)->alloc0).bytesUsed
        ;
        UNLOCK();
        LOCK();
        paVar1 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             ((((this_01._M_head_impl)->alloc0).end + ((this_01._M_head_impl)->alloc1).end) -
             (((this_01._M_head_impl)->alloc0).cur + ((this_01._M_head_impl)->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &(((this_01._M_head_impl)->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             ((this_01._M_head_impl)->alloc1).bytesWasted +
             ((this_01._M_head_impl)->alloc0).bytesWasted;
        UNLOCK();
      }
      ((this_01._M_head_impl)->alloc0).bytesUsed = 0;
      ((this_01._M_head_impl)->alloc0).bytesWasted = 0;
      ((this_01._M_head_impl)->alloc0).end = 0;
      ((this_01._M_head_impl)->alloc0).allocBlockSize = 0;
      ((this_01._M_head_impl)->alloc0).ptr = (char *)0x0;
      ((this_01._M_head_impl)->alloc0).cur = 0;
      ((this_01._M_head_impl)->alloc0).allocBlockSize = (pBVar11->alloc).defaultBlockSize;
      ((this_01._M_head_impl)->alloc1).ptr = (char *)0x0;
      ((this_01._M_head_impl)->alloc1).cur = 0;
      ((this_01._M_head_impl)->alloc1).end = 0;
      ((this_01._M_head_impl)->alloc1).allocBlockSize = 0;
      ((this_01._M_head_impl)->alloc1).bytesUsed = 0;
      ((this_01._M_head_impl)->alloc1).bytesWasted = 0;
      ((this_01._M_head_impl)->alloc1).allocBlockSize = (pBVar11->alloc).defaultBlockSize;
      LOCK();
      ((this_01._M_head_impl)->alloc)._M_b._M_p = this_00;
      UNLOCK();
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      local_90._M_t.
      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
           (tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            )(tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              )this_01._M_head_impl;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(pBVar11->alloc).thread_local_allocators,(value_type *)&local_90);
      Lock<embree::MutexSys>::~Lock(&lock);
      Lock<embree::MutexSys>::~Lock(&local_b0);
    }
    plVar4 = (long *)((long)&(this_02->alloc0).bytesUsed + uVar17);
    *plVar4 = (long)&local_e8->mutex + *plVar4;
    lVar16 = *(long *)((long)&(this_02->alloc0).cur + uVar17);
    uVar18 = (ulong)(-(int)lVar16 & 0xf);
    uVar14 = (long)&local_e8->mutex + uVar18 + lVar16;
    *(ulong *)((long)&(this_02->alloc0).cur + uVar17) = uVar14;
    if (*(ulong *)((long)&(this_02->alloc0).end + uVar17) < uVar14) {
      *(long *)((long)&(this_02->alloc0).cur + uVar17) = lVar16;
      pMVar13 = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar17);
      if (pMVar13 < (MutexSys *)((long)local_e8 << 2)) {
        puVar15 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      }
      else {
        lock.mutex = pMVar13;
        puVar15 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&lock);
        *(undefined4 **)((long)&(this_02->alloc0).ptr + uVar17) = puVar15;
        lVar16 = (*(long *)((long)&(this_02->alloc0).end + uVar17) -
                 *(long *)((long)&(this_02->alloc0).cur + uVar17)) +
                 *(long *)((long)&(this_02->alloc0).bytesWasted + uVar17);
        *(long *)((long)&(this_02->alloc0).bytesWasted + uVar17) = lVar16;
        *(undefined8 *)((long)&(this_02->alloc0).cur + uVar17) = 0;
        *(MutexSys **)((long)&(this_02->alloc0).end + uVar17) = lock.mutex;
        *(MutexSys **)((long)&(this_02->alloc0).cur + uVar17) = local_e8;
        if (lock.mutex < local_e8) {
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar17) = 0;
          lock.mutex = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar17);
          puVar15 = (undefined4 *)FastAllocator::malloc(this_00,(size_t)&lock);
          *(undefined4 **)((long)&(this_02->alloc0).ptr + uVar17) = puVar15;
          lVar16 = (*(long *)((long)&(this_02->alloc0).end + uVar17) -
                   *(long *)((long)&(this_02->alloc0).cur + uVar17)) +
                   *(long *)((long)&(this_02->alloc0).bytesWasted + uVar17);
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar17) = lVar16;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar17) = 0;
          *(MutexSys **)((long)&(this_02->alloc0).end + uVar17) = lock.mutex;
          *(MutexSys **)((long)&(this_02->alloc0).cur + uVar17) = local_e8;
          if (lock.mutex < local_e8) {
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar17) = 0;
            puVar15 = (undefined4 *)0x0;
            goto LAB_005418b3;
          }
        }
        *(long *)((long)&(this_02->alloc0).bytesWasted + uVar17) = lVar16;
      }
    }
    else {
      plVar4 = (long *)((long)&(this_02->alloc0).bytesWasted + uVar17);
      *plVar4 = *plVar4 + uVar18;
      puVar15 = (undefined4 *)
                ((uVar14 - (long)local_e8) + *(long *)((long)&(this_02->alloc0).ptr + uVar17));
    }
LAB_005418b3:
    uVar19 = uVar19 + 1;
    uVar9 = *(undefined4 *)((long)&((local_d8.items)->lower).field_0 + lVar21);
    *puVar15 = *(undefined4 *)((long)local_d8.items + lVar21 + -0x10);
    puVar15[1] = uVar9;
    fVar6 = *(float *)&local_a0->objectID_;
    LOCK();
    paVar2 = &local_e0->nextRef;
    iVar7 = (paVar2->super___atomic_base<int>)._M_i;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pBVar12 = (local_e0->refs).items;
    pBVar3 = pBVar12 + iVar7;
    (pBVar3->super_PrimRef).lower.field_0.m128[0] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[0];
    (pBVar3->super_PrimRef).lower.field_0.m128[1] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[1];
    (pBVar3->super_PrimRef).lower.field_0.m128[2] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[2];
    (pBVar3->super_PrimRef).lower.field_0.m128[3] = fVar6;
    pVVar5 = &pBVar12[iVar7].super_PrimRef.upper;
    (pVVar5->field_0).m128[0] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[0];
    (pVVar5->field_0).m128[1] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[1];
    (pVVar5->field_0).m128[2] =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[2];
    (pVVar5->field_0).m128[3] = 1.4013e-45;
    pBVar12[iVar7].node.ptr = (ulong)puVar15 | 9;
    pBVar12[iVar7].bounds_area = 0.0;
    lVar21 = lVar21 + 0x20;
  } while( true );
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }